

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(data_view *data,DataType baseType,defV *val)

{
  data_view *extraout_RDX;
  data_view *data_00;
  char *pcVar1;
  pointer pdVar2;
  ulong uVar3;
  basic_string_view<char,_std::char_traits<char>_> val_1;
  undefined1 local_58 [40];
  __index_type local_30;
  anon_class_8_1_8991fb9c local_20;
  
  if ((baseType == HELICS_ANY) || (data_00 = (data_view *)val, baseType == HELICS_UNKNOWN)) {
    baseType = detail::detectType((byte *)(data->dblock)._M_str);
    data_00 = extraout_RDX;
  }
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(double *)local_58);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,(double *)local_58);
    break;
  case HELICS_INT:
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_58);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,(long *)local_58);
    break;
  case HELICS_COMPLEX:
    local_58._0_8_ = 0.0;
    local_58._8_8_ = (pointer)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(complex<double> *)local_58);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,(complex<double> *)local_58);
    break;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)local_58,data);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,(vector<double,_std::allocator<double>_> *)local_58);
    goto LAB_0025fe29;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_58,data)
    ;
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       local_58);
LAB_0025fe29:
    if ((double)local_58._0_8_ == 0.0) {
      return;
    }
    uVar3 = local_58._16_8_ - local_58._0_8_;
    goto LAB_0025fe39;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_58,data);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,(NamedPoint *)local_58);
    if (local_58._0_8_ == (long)local_58 + 0x10) {
      return;
    }
    goto LAB_0025fd8a;
  case HELICS_TIME|HELICS_INT:
  case HELICS_TIME|HELICS_COMPLEX:
  case HELICS_TIME|HELICS_VECTOR:
  case HELICS_TIME|HELICS_COMPLEX_VECTOR:
  case HELICS_TIME|HELICS_NAMED_POINT:
  case HELICS_TIME|HELICS_BOOL:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case HELICS_JSON|HELICS_DOUBLE:
  case 0x20:
    break;
  case HELICS_JSON:
    readJsonValue_abi_cxx11_((defV *)local_58,(helics *)data,data_00);
    local_20.this =
         (_Move_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
          *)val;
    (*CLI::std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
      ::_S_vtable._M_arr[(long)(char)local_30 + 1]._M_data)
              (&local_20,
               (variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)local_58);
    CLI::std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)local_58);
    break;
  case HELICS_UNKNOWN:
  case HELICS_CUSTOM:
  case HELICS_MULTI:
    pdVar2 = (pointer)(data->dblock)._M_str;
    pcVar1 = (char *)((data->dblock)._M_len + (long)pdVar2);
    goto LAB_0025fd64;
  default:
    if (baseType != HELICS_ANY) {
      return;
    }
  case HELICS_STRING:
  case HELICS_BOOL:
  case HELICS_CHAR:
    local_58._0_8_ = 0.0;
    local_58._8_8_ = (pointer)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_58);
    pcVar1 = (char *)(local_58._0_8_ + local_58._8_8_);
    pdVar2 = (pointer)local_58._8_8_;
LAB_0025fd64:
    local_58._0_8_ = (long)local_58 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pdVar2,pcVar1);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)val,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
               );
    if (local_58._0_8_ != (long)local_58 + 0x10) {
LAB_0025fd8a:
      uVar3 = local_58._16_8_ + 1;
LAB_0025fe39:
      operator_delete((void *)local_58._0_8_,uVar3);
    }
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, defV& val)
{
    if (baseType == DataType::HELICS_ANY || baseType == DataType::HELICS_UNKNOWN) {
        baseType = detail::detectType(data.bytes());
    }
    switch (baseType) {
        case DataType::HELICS_DOUBLE:
            val = ValueConverter<double>::interpret(data);
            break;
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            val = ValueConverter<int64_t>::interpret(data);
            break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        case DataType::HELICS_BOOL:
        case DataType::HELICS_ANY:
            val = std::string(ValueConverter<std::string_view>::interpret(data));
            break;
        case DataType::HELICS_UNKNOWN:
        case DataType::HELICS_CUSTOM:
        case DataType::HELICS_MULTI:
            val = data.string();
            break;
        case DataType::HELICS_VECTOR:
            val = ValueConverter<std::vector<double>>::interpret(data);
            break;
        case DataType::HELICS_COMPLEX:
            val = ValueConverter<std::complex<double>>::interpret(data);
            break;
        case DataType::HELICS_COMPLEX_VECTOR:
            val = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            break;
        case DataType::HELICS_NAMED_POINT:
            val = ValueConverter<NamedPoint>::interpret(data);
            break;
        case DataType::HELICS_JSON:
            val = readJsonValue(data);
            break;
    }
}